

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall rest_rpc::rpc_client::async_reconnect(rpc_client *this)

{
  long in_RDI;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_00000020;
  rpc_client *in_stack_00000030;
  rpc_client *in_stack_00000090;
  duration<long,std::ratio<1l,1000l>> local_10 [16];
  
  reset_socket(in_stack_00000090);
  async_connect(in_stack_00000030);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
            (local_10,(unsigned_long *)(in_RDI + 0xb8));
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_00000020);
  return;
}

Assistant:

void async_reconnect() {
    reset_socket();
    async_connect();
    std::this_thread::sleep_for(std::chrono::milliseconds(connect_timeout_));
  }